

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O2

void __thiscall ncnn::Mat::substract_mean_normalize(Mat *this,float *mean_vals,float *norm_vals)

{
  float fVar1;
  int *piVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  Layer *pLVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  Mat local_118;
  ParamDict pd;
  Option opt;
  size_t local_78;
  void *local_70;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 local_60;
  undefined4 uStack_5c;
  int local_58;
  Allocator *local_50;
  int iStack_48;
  int iStack_44;
  int iStack_40;
  undefined8 uStack_3c;
  size_t local_30;
  
  if (norm_vals == (float *)0x0 && mean_vals != (float *)0x0) {
    pLVar7 = create_layer(3);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,this->c);
    (*pLVar7->_vptr_Layer[2])(pLVar7,&pd);
    local_78 = 0;
    opt.lightmode = false;
    opt.use_shader_pack8 = false;
    opt.use_subgroup_ops = false;
    opt.use_reserved_0 = false;
    opt.num_threads = 0;
    opt.blob_allocator._0_4_ = 0;
    opt.blob_allocator._4_4_ = 0;
    opt.workspace_allocator._0_4_ = 0;
    opt.workspace_allocator._4_4_ = 0;
    opt.openmp_blocktime = 0;
    opt.use_bf16_storage = false;
    opt.use_fp16_packed = false;
    opt.use_fp16_storage = false;
    opt.use_fp16_arithmetic = false;
    opt.use_int8_packed = false;
    opt.use_int8_storage = false;
    opt.use_int8_arithmetic = false;
    opt.use_packing_layout = false;
    opt.vulkan_device_index = 0;
    opt.use_reserved_1 = false;
    opt.use_image_storage = false;
    opt.use_tensor_storage = false;
    opt.use_reserved_2 = false;
    opt.flush_denormals = 0;
    opt.use_local_pool_allocator = false;
    opt.use_shader_local_memory = false;
    opt.use_cooperative_matrix = false;
    opt.use_winograd23_convolution = false;
    opt.use_winograd43_convolution = false;
    opt.use_winograd63_convolution = false;
    opt.use_a53_a55_optimized_kernel = false;
    opt.use_fp16_uniform = false;
    local_118.cstep = 0;
    local_118.data = (void *)0x0;
    local_118.refcount._0_4_ = 0;
    local_118.refcount._4_4_ = 0;
    local_118.elemsize._0_4_ = 0;
    local_118.elemsize._4_4_ = 0;
    local_118.elempack = 0;
    local_118.allocator = (Allocator *)0x0;
    local_118.dims = 0;
    local_118.w = 0;
    local_118.h = 0;
    local_118.d = 0;
    local_118.c = 0;
    create(&local_118,this->c,4,(Allocator *)0x0);
    piVar2 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = (int *)CONCAT44(opt.blob_allocator._4_4_,opt.blob_allocator._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (opt._32_8_ == 0) {
          free((void *)opt._0_8_);
        }
        else {
          (**(code **)(*(long *)opt._32_8_ + 0x18))();
        }
      }
    }
    piVar2 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
    opt._0_8_ = local_118.data;
    opt.blob_allocator._0_4_ = local_118.refcount._0_4_;
    opt.blob_allocator._4_4_ = local_118.refcount._4_4_;
    opt.workspace_allocator._0_4_ = (undefined4)local_118.elemsize;
    opt.workspace_allocator._4_4_ = local_118.elemsize._4_4_;
    opt.openmp_blocktime = local_118.elempack;
    opt._32_8_ = local_118.allocator;
    opt.vulkan_device_index = local_118.dims;
    opt.use_reserved_1 = (bool)(undefined1)local_118.w;
    opt.use_image_storage = (bool)local_118.w._1_1_;
    opt.use_tensor_storage = (bool)local_118.w._2_1_;
    opt.use_reserved_2 = (bool)local_118.w._3_1_;
    opt.flush_denormals = local_118.h;
    uVar5._0_4_ = local_118.d;
    uVar5._4_4_ = local_118.c;
    opt._52_8_ = local_118._52_8_;
    local_78 = local_118.cstep;
    uVar6 = uVar5;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      uVar6 = opt._52_8_;
      if (*piVar2 == 0) {
        opt._52_8_ = uVar5;
        if (local_118.allocator == (Allocator *)0x0) {
          free(local_118.data);
          uVar6 = opt._52_8_;
        }
        else {
          (*(local_118.allocator)->_vptr_Allocator[3])();
          uVar6 = opt._52_8_;
        }
      }
    }
    opt._52_8_ = uVar6;
    uVar9 = 0;
    uVar8 = (ulong)(uint)this->c;
    if (this->c < 1) {
      uVar8 = uVar9;
    }
    for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
      *(float *)(opt._0_8_ + uVar9 * 4) = -mean_vals[uVar9];
    }
    ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&local_118,(Mat *)&opt);
    (*pLVar7->_vptr_Layer[3])(pLVar7,&local_118);
    ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&local_118);
    piVar2 = (int *)CONCAT44(opt.blob_allocator._4_4_,opt.blob_allocator._0_4_);
    if (piVar2 == (int *)0x0) goto LAB_0013efdf;
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 != 0) goto LAB_0013efdf;
    if (opt._32_8_ != 0) {
      (**(code **)(*(long *)opt._32_8_ + 0x18))();
      goto LAB_0013efdf;
    }
  }
  else {
    if (mean_vals != (float *)0x0 || norm_vals == (float *)0x0) {
      if (mean_vals == (float *)0x0 || norm_vals == (float *)0x0) {
        return;
      }
      pLVar7 = create_layer(0x1d);
      ParamDict::ParamDict(&pd);
      ParamDict::set(&pd,0,this->c);
      ParamDict::set(&pd,1,1);
      (*pLVar7->_vptr_Layer[2])(pLVar7,&pd);
      local_78 = 0;
      opt.lightmode = false;
      opt.use_shader_pack8 = false;
      opt.use_subgroup_ops = false;
      opt.use_reserved_0 = false;
      opt.num_threads = 0;
      opt.blob_allocator._0_4_ = 0;
      opt.blob_allocator._4_4_ = 0;
      opt.workspace_allocator._0_4_ = 0;
      opt.workspace_allocator._4_4_ = 0;
      opt.openmp_blocktime = 0;
      opt.use_bf16_storage = false;
      opt.use_fp16_packed = false;
      opt.use_fp16_storage = false;
      opt.use_fp16_arithmetic = false;
      opt.use_int8_packed = false;
      opt.use_int8_storage = false;
      opt.use_int8_arithmetic = false;
      opt.use_packing_layout = false;
      opt.vulkan_device_index = 0;
      opt.use_reserved_1 = false;
      opt.use_image_storage = false;
      opt.use_tensor_storage = false;
      opt.use_reserved_2 = false;
      opt.flush_denormals = 0;
      opt.use_local_pool_allocator = false;
      opt.use_shader_local_memory = false;
      opt.use_cooperative_matrix = false;
      opt.use_winograd23_convolution = false;
      opt.use_winograd43_convolution = false;
      opt.use_winograd63_convolution = false;
      opt.use_a53_a55_optimized_kernel = false;
      opt.use_fp16_uniform = false;
      local_30 = 0;
      local_70 = (void *)0x0;
      uStack_68 = 0;
      uStack_64 = 0;
      local_60 = 0;
      uStack_5c = 0;
      local_58 = 0;
      local_50 = (Allocator *)0x0;
      iStack_48 = 0;
      iStack_44 = 0;
      iStack_40 = 0;
      uStack_3c = 0;
      local_118.cstep = 0;
      local_118.data = (void *)0x0;
      local_118.refcount._0_4_ = 0;
      local_118.refcount._4_4_ = 0;
      local_118.elemsize._0_4_ = 0;
      local_118.elemsize._4_4_ = 0;
      local_118.elempack = 0;
      local_118.allocator = (Allocator *)0x0;
      local_118.dims = 0;
      local_118.w = 0;
      local_118.h = 0;
      local_118.d = 0;
      local_118.c = 0;
      create(&local_118,this->c,4,(Allocator *)0x0);
      piVar2 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      piVar2 = (int *)CONCAT44(opt.blob_allocator._4_4_,opt.blob_allocator._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (opt._32_8_ == 0) {
            free((void *)opt._0_8_);
          }
          else {
            (**(code **)(*(long *)opt._32_8_ + 0x18))();
          }
        }
      }
      piVar2 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
      opt._0_8_ = local_118.data;
      opt.blob_allocator._0_4_ = local_118.refcount._0_4_;
      opt.blob_allocator._4_4_ = local_118.refcount._4_4_;
      opt.workspace_allocator._0_4_ = (undefined4)local_118.elemsize;
      opt.workspace_allocator._4_4_ = local_118.elemsize._4_4_;
      opt.openmp_blocktime = local_118.elempack;
      opt._32_8_ = local_118.allocator;
      opt.vulkan_device_index = local_118.dims;
      opt.use_reserved_1 = (bool)(undefined1)local_118.w;
      opt.use_image_storage = (bool)local_118.w._1_1_;
      opt.use_tensor_storage = (bool)local_118.w._2_1_;
      opt.use_reserved_2 = (bool)local_118.w._3_1_;
      opt.flush_denormals = local_118.h;
      uVar6._0_4_ = local_118.d;
      uVar6._4_4_ = local_118.c;
      opt._52_8_ = local_118._52_8_;
      local_78 = local_118.cstep;
      uVar5 = uVar6;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        uVar5 = opt._52_8_;
        if (*piVar2 == 0) {
          opt._52_8_ = uVar6;
          if (local_118.allocator == (Allocator *)0x0) {
            free(local_118.data);
            uVar5 = opt._52_8_;
          }
          else {
            (*(local_118.allocator)->_vptr_Allocator[3])();
            uVar5 = opt._52_8_;
          }
        }
      }
      opt._52_8_ = uVar5;
      local_118.cstep = 0;
      local_118.data = (void *)0x0;
      local_118.refcount._0_4_ = 0;
      local_118.refcount._4_4_ = 0;
      local_118.elemsize._0_4_ = 0;
      local_118.elemsize._4_4_ = 0;
      local_118.elempack = 0;
      local_118.allocator = (Allocator *)0x0;
      local_118.dims = 0;
      local_118.w = 0;
      local_118.h = 0;
      local_118.d = 0;
      local_118.c = 0;
      create(&local_118,this->c,4,(Allocator *)0x0);
      piVar2 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      piVar2 = (int *)CONCAT44(uStack_64,uStack_68);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (local_50 == (Allocator *)0x0) {
            free(local_70);
          }
          else {
            (**(code **)(*(long *)local_50 + 0x18))();
          }
        }
      }
      piVar2 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
      local_70 = local_118.data;
      uStack_68 = local_118.refcount._0_4_;
      uStack_64 = local_118.refcount._4_4_;
      local_60 = (undefined4)local_118.elemsize;
      uStack_5c = local_118.elemsize._4_4_;
      local_58 = local_118.elempack;
      local_50 = local_118.allocator;
      iStack_48 = local_118.dims;
      iStack_44 = local_118.w;
      iStack_40 = local_118.h;
      uVar4._0_4_ = local_118.d;
      uVar4._4_4_ = local_118.c;
      uStack_3c._0_4_ = local_118.d;
      uStack_3c._4_4_ = local_118.c;
      local_30 = local_118.cstep;
      uVar5 = uVar4;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        uVar5 = uStack_3c;
        if (*piVar2 == 0) {
          uStack_3c = uVar4;
          if (local_118.allocator == (Allocator *)0x0) {
            free(local_118.data);
            uVar5 = uStack_3c;
          }
          else {
            (*(local_118.allocator)->_vptr_Allocator[3])();
            uVar5 = uStack_3c;
          }
        }
      }
      uStack_3c = uVar5;
      uVar9 = 0;
      uVar8 = (ulong)(uint)this->c;
      if (this->c < 1) {
        uVar8 = uVar9;
      }
      for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
        fVar1 = norm_vals[uVar9];
        *(float *)(opt._0_8_ + uVar9 * 4) = fVar1;
        *(float *)((long)local_70 + uVar9 * 4) = -mean_vals[uVar9] * fVar1;
      }
      ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&local_118,(Mat *)&opt);
      (*pLVar7->_vptr_Layer[3])(pLVar7,&local_118);
      ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&local_118);
      lVar10 = 0x48;
      do {
        piVar2 = *(int **)((long)&opt.blob_allocator + lVar10);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (*(long **)(&opt.use_bf16_storage + lVar10) == (long *)0x0) {
              free(*(void **)(&opt.lightmode + lVar10));
            }
            else {
              (**(code **)(**(long **)(&opt.use_bf16_storage + lVar10) + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)&local_78 + lVar10) = 0;
        *(undefined8 *)((long)&opt.blob_allocator + lVar10 + 4) = 0;
        *(undefined8 *)((long)&opt.workspace_allocator + lVar10 + 4) = 0;
        *(undefined8 *)(&opt.lightmode + lVar10) = 0;
        *(undefined8 *)((long)&opt.blob_allocator + lVar10) = 0;
        *(undefined4 *)(&opt.use_winograd43_convolution + lVar10) = 0;
        *(undefined8 *)((long)&opt.vulkan_device_index + lVar10) = 0;
        *(undefined8 *)((long)&opt.flush_denormals + lVar10) = 0;
        lVar10 = lVar10 + -0x48;
      } while (lVar10 != -0x48);
      goto LAB_0013efdf;
    }
    pLVar7 = create_layer(0x1d);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,this->c);
    (*pLVar7->_vptr_Layer[2])(pLVar7,&pd);
    local_78 = 0;
    opt.lightmode = false;
    opt.use_shader_pack8 = false;
    opt.use_subgroup_ops = false;
    opt.use_reserved_0 = false;
    opt.num_threads = 0;
    opt.blob_allocator._0_4_ = 0;
    opt.blob_allocator._4_4_ = 0;
    opt.workspace_allocator._0_4_ = 0;
    opt.workspace_allocator._4_4_ = 0;
    opt.openmp_blocktime = 0;
    opt.use_bf16_storage = false;
    opt.use_fp16_packed = false;
    opt.use_fp16_storage = false;
    opt.use_fp16_arithmetic = false;
    opt.use_int8_packed = false;
    opt.use_int8_storage = false;
    opt.use_int8_arithmetic = false;
    opt.use_packing_layout = false;
    opt.vulkan_device_index = 0;
    opt.use_reserved_1 = false;
    opt.use_image_storage = false;
    opt.use_tensor_storage = false;
    opt.use_reserved_2 = false;
    opt.flush_denormals = 0;
    opt.use_local_pool_allocator = false;
    opt.use_shader_local_memory = false;
    opt.use_cooperative_matrix = false;
    opt.use_winograd23_convolution = false;
    opt.use_winograd43_convolution = false;
    opt.use_winograd63_convolution = false;
    opt.use_a53_a55_optimized_kernel = false;
    opt.use_fp16_uniform = false;
    local_118.cstep = 0;
    local_118.data = (void *)0x0;
    local_118.refcount._0_4_ = 0;
    local_118.refcount._4_4_ = 0;
    local_118.elemsize._0_4_ = 0;
    local_118.elemsize._4_4_ = 0;
    local_118.elempack = 0;
    local_118.allocator = (Allocator *)0x0;
    local_118.dims = 0;
    local_118.w = 0;
    local_118.h = 0;
    local_118.d = 0;
    local_118.c = 0;
    create(&local_118,this->c,4,(Allocator *)0x0);
    piVar2 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = (int *)CONCAT44(opt.blob_allocator._4_4_,opt.blob_allocator._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (opt._32_8_ == 0) {
          free((void *)opt._0_8_);
        }
        else {
          (**(code **)(*(long *)opt._32_8_ + 0x18))();
        }
      }
    }
    piVar2 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
    opt._0_8_ = local_118.data;
    opt.blob_allocator._0_4_ = local_118.refcount._0_4_;
    opt.blob_allocator._4_4_ = local_118.refcount._4_4_;
    opt.workspace_allocator._0_4_ = (undefined4)local_118.elemsize;
    opt.workspace_allocator._4_4_ = local_118.elemsize._4_4_;
    opt.openmp_blocktime = local_118.elempack;
    opt._32_8_ = local_118.allocator;
    opt.vulkan_device_index = local_118.dims;
    opt.use_reserved_1 = (bool)(undefined1)local_118.w;
    opt.use_image_storage = (bool)local_118.w._1_1_;
    opt.use_tensor_storage = (bool)local_118.w._2_1_;
    opt.use_reserved_2 = (bool)local_118.w._3_1_;
    opt.flush_denormals = local_118.h;
    uVar3._0_4_ = local_118.d;
    uVar3._4_4_ = local_118.c;
    opt._52_8_ = local_118._52_8_;
    local_78 = local_118.cstep;
    uVar5 = uVar3;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      uVar5 = opt._52_8_;
      if (*piVar2 == 0) {
        opt._52_8_ = uVar3;
        if (local_118.allocator == (Allocator *)0x0) {
          free(local_118.data);
          uVar5 = opt._52_8_;
        }
        else {
          (*(local_118.allocator)->_vptr_Allocator[3])();
          uVar5 = opt._52_8_;
        }
      }
    }
    opt._52_8_ = uVar5;
    uVar9 = 0;
    uVar8 = (ulong)(uint)this->c;
    if (this->c < 1) {
      uVar8 = uVar9;
    }
    for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
      *(float *)(opt._0_8_ + uVar9 * 4) = norm_vals[uVar9];
    }
    ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&local_118,(Mat *)&opt);
    (*pLVar7->_vptr_Layer[3])(pLVar7,&local_118);
    ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&local_118);
    piVar2 = (int *)CONCAT44(opt.blob_allocator._4_4_,opt.blob_allocator._0_4_);
    if (piVar2 == (int *)0x0) goto LAB_0013efdf;
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 != 0) goto LAB_0013efdf;
    if (opt._32_8_ != 0) {
      (**(code **)(*(long *)opt._32_8_ + 0x18))();
      goto LAB_0013efdf;
    }
  }
  free((void *)opt._0_8_);
LAB_0013efdf:
  ParamDict::~ParamDict(&pd);
  Option::Option(&opt);
  opt.num_threads = 1;
  (*pLVar7->_vptr_Layer[4])(pLVar7,&opt);
  (*pLVar7->_vptr_Layer[9])(pLVar7,this,&opt);
  (*pLVar7->_vptr_Layer[5])(pLVar7,&opt);
  (*pLVar7->_vptr_Layer[1])(pLVar7);
  return;
}

Assistant:

void Mat::substract_mean_normalize(const float* mean_vals, const float* norm_vals)
{
    Layer* op;

    if (mean_vals && !norm_vals)
    {
        // substract mean only
        op = create_layer(LayerType::Bias);

        ParamDict pd;
        pd.set(0, c);

        op->load_param(pd);

        Mat weights[1];
        weights[0] = Mat(c);
        for (int q = 0; q < c; q++)
        {
            weights[0][q] = -mean_vals[q];
        }

        op->load_model(ModelBinFromMatArray(weights));
    }
    else if (!mean_vals && norm_vals)
    {
        // normalize only
        op = create_layer(LayerType::Scale);

        ParamDict pd;
        pd.set(0, c);

        op->load_param(pd);

        Mat weights[1];
        weights[0] = Mat(c);
        for (int q = 0; q < c; q++)
        {
            weights[0][q] = norm_vals[q];
        }

        op->load_model(ModelBinFromMatArray(weights));
    }
    else if (mean_vals && norm_vals)
    {
        // substract mean and normalize
        op = create_layer(LayerType::Scale);

        ParamDict pd;
        pd.set(0, c);
        pd.set(1, 1);

        op->load_param(pd);

        Mat weights[2];
        weights[0] = Mat(c);
        weights[1] = Mat(c);
        for (int q = 0; q < c; q++)
        {
            weights[0][q] = norm_vals[q];
            weights[1][q] = -mean_vals[q] * norm_vals[q];
        }

        op->load_model(ModelBinFromMatArray(weights));
    }
    else // if (!mean_vals && !norm_vals)
    {
        return;
    }

    Option opt;
    opt.num_threads = 1; // TODO

    op->create_pipeline(opt);

    op->forward_inplace(*this, opt);

    op->destroy_pipeline(opt);

    delete op;
}